

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_log.cpp
# Opt level: O1

int anon_unknown.dwarf_6a681::trace_indent_line(TraceState *state)

{
  int iVar1;
  _Elt_pointer piVar2;
  size_t sVar3;
  
  piVar2 = (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 == (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!state.current_depths.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/trace_log.cpp"
                  ,0x34,"int (anonymous namespace)::trace_indent_line(TraceState &)");
  }
  if (piVar2 == (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar2 = (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar1 = piVar2[-1];
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    if (0x4f < iVar1) {
      __assert_fail("width >=0 && width< 160",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/trace_log.cpp"
                    ,0x39,"int (anonymous namespace)::trace_indent_line(TraceState &)");
    }
    sVar3 = fwrite("                                                                                                                                                                                                                                                      "
                   ,1,(ulong)(uint)(iVar1 * 2),(FILE *)state->report);
    iVar1 = (int)sVar3;
  }
  return iVar1;
}

Assistant:

int trace_indent_line(TraceState &state) {
	static const char spaces[]="                                                                                                                                                                                                                                                      ";

	assert(!state.current_depths.empty());
	int width = state.current_depths.top() * 2;

	if (width <= 0) return 0;

	assert(width >=0 && width< 160);
	return (int)fwrite(spaces, 1, width, state.report);
}